

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O2

void __thiscall YAML::Scanner::ScanFlowEnd(Scanner *this)

{
  bool bVar1;
  char cVar2;
  _Elt_pointer pFVar3;
  ParserException *pPVar4;
  _Elt_pointer pFVar5;
  _Elt_pointer pFVar6;
  allocator local_81;
  Mark local_80;
  undefined1 local_70 [32];
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  pointer local_38;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined8 uStack_24;
  
  pFVar3 = (this->m_flows).c.
           super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pFVar3 == (this->m_flows).c.
                super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pPVar4 = (ParserException *)__cxa_allocate_exception(0x40);
    local_80.pos = (this->INPUT).m_mark.pos;
    local_80.line = (this->INPUT).m_mark.line;
    local_80.column = (this->INPUT).m_mark.column;
    std::__cxx11::string::string((string *)local_70,"illegal flow end",&local_81);
    ParserException::ParserException(pPVar4,&local_80,(string *)local_70);
    __cxa_throw(pPVar4,&ParserException::typeinfo,BadConversion::~BadConversion);
  }
  pFVar5 = (this->m_flows).c.
           super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
  pFVar6 = pFVar3;
  if (pFVar3 == pFVar5) {
    pFVar6 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  if (pFVar6[-1] == FLOW_MAP) {
    bVar1 = VerifySimpleKey(this);
    if (bVar1) {
      local_70._8_4_ = (this->INPUT).m_mark.pos;
      local_70._12_4_ = (this->INPUT).m_mark.line;
      local_70._16_4_ = (this->INPUT).m_mark.column;
      local_70._24_8_ = &local_48;
      local_70._0_8_ = (pointer)0xf00000000;
      local_50 = 0;
      local_48._M_local_buf[0] = '\0';
      local_38 = (pointer)0x0;
      uStack_30 = 0;
      uStack_2c = 0;
      uStack_28 = 0;
      uStack_24 = 0;
      std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
                (&(this->m_tokens).c,(Token *)local_70);
      Token::~Token((Token *)local_70);
      goto LAB_006a8876;
    }
    pFVar3 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pFVar5 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
  }
  if (pFVar3 == pFVar5) {
    pFVar3 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  if (pFVar3[-1] == FLOW_SEQ) {
    InvalidateSimpleKey(this);
  }
LAB_006a8876:
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = true;
  local_80.pos = (this->INPUT).m_mark.pos;
  local_80.line = (this->INPUT).m_mark.line;
  local_80.column = (this->INPUT).m_mark.column;
  cVar2 = YAML::Stream::get(&this->INPUT);
  pFVar3 = (this->m_flows).c.
           super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pFVar3 == (this->m_flows).c.
                super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pFVar3 = (this->m_flows).c.
             super__Deque_base<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
  }
  if (pFVar3[-1] == (uint)(cVar2 == ']')) {
    std::deque<YAML::Scanner::FLOW_MARKER,_std::allocator<YAML::Scanner::FLOW_MARKER>_>::pop_back
              (&(this->m_flows).c);
    local_70._24_8_ = &local_48;
    local_70._0_8_ = (ulong)(cVar2 == ']') << 0x20 ^ 0xb00000000;
    local_70._8_4_ = local_80.pos;
    local_70._12_4_ = local_80.line;
    local_70._16_4_ = local_80.column;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_38 = (pointer)0x0;
    uStack_30 = 0;
    uStack_2c = 0;
    uStack_28 = 0;
    uStack_24 = 0;
    std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
              (&(this->m_tokens).c,(Token *)local_70);
    Token::~Token((Token *)local_70);
    return;
  }
  pPVar4 = (ParserException *)__cxa_allocate_exception(0x40);
  std::__cxx11::string::string((string *)local_70,"illegal flow end",&local_81);
  ParserException::ParserException(pPVar4,&local_80,(string *)local_70);
  __cxa_throw(pPVar4,&ParserException::typeinfo,BadConversion::~BadConversion);
}

Assistant:

void Scanner::ScanFlowEnd() {
  if (InBlockContext())
    throw ParserException(INPUT.mark(), ErrorMsg::FLOW_END);

  // we might have a solo entry in the flow context
  if (InFlowContext()) {
    if (m_flows.top() == FLOW_MAP && VerifySimpleKey())
      m_tokens.push(Token(Token::VALUE, INPUT.mark()));
    else if (m_flows.top() == FLOW_SEQ)
      InvalidateSimpleKey();
  }

  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = true;

  // eat
  Mark mark = INPUT.mark();
  char ch = INPUT.get();

  // check that it matches the start
  FLOW_MARKER flowType = (ch == Keys::FlowSeqEnd ? FLOW_SEQ : FLOW_MAP);
  if (m_flows.top() != flowType)
    throw ParserException(mark, ErrorMsg::FLOW_END);
  m_flows.pop();

  Token::TYPE type = (flowType ? Token::FLOW_SEQ_END : Token::FLOW_MAP_END);
  m_tokens.push(Token(type, mark));
}